

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_suite.cpp
# Opt level: O0

void api_dynamic_suite::dynamic_ctor_copy(void)

{
  undefined4 local_54;
  size_type local_50 [2];
  undefined1 local_40 [8];
  span<int,_18446744073709551615UL> clone;
  size_type local_28 [2];
  undefined1 local_18 [8];
  span<int,_18446744073709551615UL> span;
  
  vista::span<int,_18446744073709551615UL>::span<true,_0>
            ((span<int,_18446744073709551615UL> *)local_18);
  local_28[0] = vista::span<int,_18446744073709551615UL>::size
                          ((span<int,_18446744073709551615UL> *)local_18);
  clone.member.tail._4_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0x23,"void api_dynamic_suite::dynamic_ctor_copy()",local_28,
             (undefined1 *)((long)&clone.member.tail + 4));
  local_40 = local_18;
  clone.member.head = span.member.head;
  local_50[0] = vista::span<int,_18446744073709551615UL>::size
                          ((span<int,_18446744073709551615UL> *)local_40);
  local_54 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0x25,"void api_dynamic_suite::dynamic_ctor_copy()",local_50,&local_54);
  return;
}

Assistant:

void dynamic_ctor_copy()
{
    static_assert(std::is_copy_constructible<vista::span<int>>::value, "span<int> must be copy-constructible");
    static_assert(std::is_nothrow_copy_constructible<vista::span<int>>::value, "span<int> must be nothrow copy-constructible");

    vista::span<int> span;
    BOOST_TEST_EQ(span.size(), 0);
    vista::span<int> clone(span);
    BOOST_TEST_EQ(clone.size(), 0);
}